

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O3

void dispose_chunk(mstate m,mchunkptr p,size_t psize)

{
  tbinptr pmVar1;
  char *pcVar2;
  malloc_tree_chunk *pmVar3;
  mchunkptr pmVar4;
  long lVar5;
  tbinptr pmVar6;
  mstate pmVar7;
  malloc_tree_chunk **ppmVar8;
  int iVar9;
  uint uVar10;
  malloc_tree_chunk *pmVar11;
  byte bVar12;
  uint uVar13;
  size_t __len;
  ulong uVar14;
  long lVar15;
  mstate pmVar16;
  tbinptr pmVar17;
  malloc_tree_chunk **ppmVar18;
  
  pmVar1 = (tbinptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk);
  if ((m->dvsize & 1) == 0) {
    uVar14 = *(ulong *)m;
    if ((m->dvsize & 2) == 0) {
      __len = (long)&p[1].prev_foot + uVar14;
      iVar9 = munmap((void *)((long)m - uVar14),__len);
      if (iVar9 != 0) {
        return;
      }
      _gm_.footprint = _gm_.footprint - __len;
      return;
    }
    m = (mstate)((long)m - uVar14);
    if (m < _gm_.least_addr) goto LAB_00106ca4;
    p = (mchunkptr)((long)&p->prev_foot + uVar14);
    if (m == (mstate)_gm_.dv) {
      if ((~(uint)pmVar1->head & 3) == 0) {
        _gm_.dvsize = (size_t)p;
        pmVar1->head = pmVar1->head & 0xfffffffffffffffe;
        m->dvsize = (ulong)p | 1;
        pmVar1->prev_foot = (size_t)p;
        return;
      }
    }
    else if (uVar14 < 0x100) {
      pmVar11 = (malloc_tree_chunk *)m->topsize;
      pmVar3 = (malloc_tree_chunk *)m->least_addr;
      if ((pmVar11 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar14 >> 3) * 2)) &&
         ((pmVar11 < _gm_.least_addr || ((mstate)pmVar11->bk != m)))) goto LAB_00106ca4;
      if (pmVar3 == pmVar11) {
        bVar12 = (byte)(uVar14 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
      }
      else {
        if ((pmVar3 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar14 >> 3) * 2)) &&
           ((pmVar3 < _gm_.least_addr || ((mstate)pmVar3->fd != m)))) goto LAB_00106ca4;
        pmVar11->bk = pmVar3;
        pmVar3->fd = pmVar11;
      }
    }
    else {
      pmVar16 = (mstate)m->least_addr;
      pmVar11 = (malloc_tree_chunk *)m->trim_check;
      if (pmVar16 == m) {
        if ((mstate)m->top == (mstate)0x0) {
          if ((mstate)m->dv == (mstate)0x0) {
            pmVar16 = (mstate)0x0;
            goto LAB_001067cd;
          }
          pmVar7 = (mstate)m->dv;
          ppmVar8 = (malloc_tree_chunk **)&m->dv;
        }
        else {
          pmVar7 = (mstate)m->top;
          ppmVar8 = (malloc_tree_chunk **)&m->top;
        }
        do {
          do {
            ppmVar18 = ppmVar8;
            pmVar16 = pmVar7;
            pmVar7 = (mstate)pmVar16->top;
            ppmVar8 = (malloc_tree_chunk **)&pmVar16->top;
          } while ((mstate)pmVar16->top != (mstate)0x0);
          pmVar7 = (mstate)pmVar16->dv;
          ppmVar8 = (malloc_tree_chunk **)&pmVar16->dv;
        } while ((mstate)pmVar16->dv != (mstate)0x0);
        if (ppmVar18 < _gm_.least_addr) goto LAB_00106ca4;
        *ppmVar18 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar3 = (malloc_tree_chunk *)m->topsize;
        if (((pmVar3 < _gm_.least_addr) || ((mstate)pmVar3->bk != m)) ||
           ((mstate)pmVar16->topsize != m)) goto LAB_00106ca4;
        pmVar3->bk = (malloc_tree_chunk *)pmVar16;
        pmVar16->topsize = (size_t)pmVar3;
      }
LAB_001067cd:
      if (pmVar11 != (malloc_tree_chunk *)0x0) {
        uVar10 = (uint)m->release_checks;
        if (m == (mstate)_gm_.treebins[uVar10]) {
          _gm_.treebins[uVar10] = (tbinptr)pmVar16;
          if (pmVar16 == (mstate)0x0) {
            bVar12 = (byte)uVar10 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
          }
          else {
LAB_00106819:
            pcVar2 = _gm_.least_addr;
            if (pmVar16 < _gm_.least_addr) goto LAB_00106ca4;
            pmVar16->trim_check = (size_t)pmVar11;
            pmVar11 = (malloc_tree_chunk *)m->dv;
            if (pmVar11 != (malloc_tree_chunk *)0x0) {
              if (pmVar11 < pcVar2) goto LAB_00106ca4;
              pmVar16->dv = (mchunkptr)pmVar11;
              pmVar11->parent = (malloc_tree_chunk *)pmVar16;
            }
            pmVar4 = m->top;
            if (pmVar4 != (mchunkptr)0x0) {
              if (pmVar4 < pcVar2) goto LAB_00106ca4;
              pmVar16->top = pmVar4;
              pmVar4[1].fd = (malloc_chunk *)pmVar16;
            }
          }
        }
        else {
          if (pmVar11 < _gm_.least_addr) goto LAB_00106ca4;
          pmVar11->child[(mstate)pmVar11->child[0] != m] = (malloc_tree_chunk *)pmVar16;
          if (pmVar16 != (mstate)0x0) goto LAB_00106819;
        }
      }
    }
  }
  if (pmVar1 < _gm_.least_addr) goto LAB_00106ca4;
  uVar14 = pmVar1->head;
  if ((uVar14 & 2) == 0) {
    if (pmVar1 == (tbinptr)_gm_.top) {
      _gm_.topsize = (long)&p->prev_foot + _gm_.topsize;
      _gm_.top = (mchunkptr)m;
      m->dvsize = _gm_.topsize | 1;
      if (m != (mstate)_gm_.dv) {
        return;
      }
      _gm_.dvsize = 0;
      _gm_.dv = (mchunkptr)0x0;
      return;
    }
    if (pmVar1 == (tbinptr)_gm_.dv) {
      uVar14 = (long)&p->prev_foot + _gm_.dvsize;
      _gm_.dvsize = uVar14;
      _gm_.dv = (mchunkptr)m;
      m->dvsize = uVar14 | 1;
      *(ulong *)((long)m->smallbins + (uVar14 - 0x48)) = uVar14;
      return;
    }
    if (uVar14 < 0x100) {
      pmVar11 = pmVar1->fd;
      pmVar3 = pmVar1->bk;
      if ((pmVar11 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar14 >> 3) * 2)) &&
         ((pmVar11 < _gm_.least_addr || (pmVar11->bk != pmVar1)))) goto LAB_00106ca4;
      if (pmVar3 == pmVar11) {
        bVar12 = (byte)(uVar14 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
      }
      else {
        if ((pmVar3 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar14 >> 3) * 2)) &&
           ((pmVar3 < _gm_.least_addr || (pmVar3->fd != pmVar1)))) goto LAB_00106ca4;
        pmVar11->bk = pmVar3;
        pmVar3->fd = pmVar11;
      }
    }
    else {
      pmVar17 = pmVar1->bk;
      pmVar11 = pmVar1->parent;
      if (pmVar17 == pmVar1) {
        if (pmVar1->child[1] == (tbinptr)0x0) {
          if (pmVar1->child[0] == (tbinptr)0x0) {
            pmVar17 = (tbinptr)0x0;
            goto LAB_00106bd1;
          }
          pmVar6 = pmVar1->child[0];
          ppmVar8 = pmVar1->child;
        }
        else {
          pmVar6 = pmVar1->child[1];
          ppmVar8 = pmVar1->child + 1;
        }
        do {
          do {
            ppmVar18 = ppmVar8;
            pmVar17 = pmVar6;
            pmVar6 = pmVar17->child[1];
            ppmVar8 = pmVar17->child + 1;
          } while (pmVar17->child[1] != (malloc_tree_chunk *)0x0);
          pmVar6 = pmVar17->child[0];
          ppmVar8 = pmVar17->child;
        } while (pmVar17->child[0] != (malloc_tree_chunk *)0x0);
        if (ppmVar18 < _gm_.least_addr) goto LAB_00106ca4;
        *ppmVar18 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar3 = pmVar1->fd;
        if (((pmVar3 < _gm_.least_addr) || (pmVar3->bk != pmVar1)) || (pmVar17->fd != pmVar1))
        goto LAB_00106ca4;
        pmVar3->bk = pmVar17;
        pmVar17->fd = pmVar3;
      }
LAB_00106bd1:
      if (pmVar11 != (malloc_tree_chunk *)0x0) {
        uVar10 = pmVar1->index;
        if (pmVar1 == _gm_.treebins[uVar10]) {
          _gm_.treebins[uVar10] = pmVar17;
          if (pmVar17 == (tbinptr)0x0) {
            bVar12 = (byte)uVar10 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar12 | 0xfffffffeU >> 0x20 - bVar12);
          }
          else {
LAB_00106c1d:
            pcVar2 = _gm_.least_addr;
            if (pmVar17 < _gm_.least_addr) goto LAB_00106ca4;
            pmVar17->parent = pmVar11;
            pmVar11 = pmVar1->child[0];
            if (pmVar11 != (malloc_tree_chunk *)0x0) {
              if (pmVar11 < pcVar2) goto LAB_00106ca4;
              pmVar17->child[0] = pmVar11;
              pmVar11->parent = pmVar17;
            }
            pmVar11 = pmVar1->child[1];
            if (pmVar11 != (malloc_tree_chunk *)0x0) {
              if (pmVar11 < pcVar2) goto LAB_00106ca4;
              pmVar17->child[1] = pmVar11;
              pmVar11->parent = pmVar17;
            }
          }
        }
        else {
          if (pmVar11 < _gm_.least_addr) goto LAB_00106ca4;
          pmVar11->child[pmVar11->child[0] != pmVar1] = pmVar17;
          if (pmVar17 != (tbinptr)0x0) goto LAB_00106c1d;
        }
      }
    }
    p = (mchunkptr)((long)&p->prev_foot + (uVar14 & 0xfffffffffffffff8));
    m->dvsize = (ulong)p | 1;
    *(mchunkptr *)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk) = p;
    if (m == (mstate)_gm_.dv) {
      _gm_.dvsize = (size_t)p;
      return;
    }
  }
  else {
    pmVar1->head = uVar14 & 0xfffffffffffffffe;
    m->dvsize = (ulong)p | 1;
    *(mchunkptr *)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk) = p;
  }
  if (p < (mchunkptr)0x100) {
    uVar14 = (ulong)p >> 3;
    if ((_gm_.smallmap >> ((uint)uVar14 & 0x1f) & 1) == 0) {
      _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar14 & 0x1f);
      pmVar11 = (malloc_tree_chunk *)(_gm_.smallbins + uVar14 * 2);
    }
    else {
      pmVar11 = (malloc_tree_chunk *)_gm_.smallbins[uVar14 * 2 + 2];
      if ((malloc_tree_chunk *)_gm_.smallbins[uVar14 * 2 + 2] < _gm_.least_addr) {
LAB_00106ca4:
        abort();
      }
    }
    _gm_.smallbins[uVar14 * 2 + 2] = (mchunkptr)m;
    pmVar11->bk = (malloc_tree_chunk *)m;
    m->topsize = (size_t)pmVar11;
    m->least_addr = (char *)(_gm_.smallbins + uVar14 * 2);
  }
  else {
    uVar10 = (uint)((ulong)p >> 8);
    if (uVar10 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = 0x1f;
      if (uVar10 < 0x10000) {
        uVar13 = 0x1f;
        if (uVar10 != 0) {
          for (; uVar10 >> uVar13 == 0; uVar13 = uVar13 - 1) {
          }
        }
        uVar13 = (uint)(((ulong)p >> ((ulong)(byte)(0x26 - (char)(uVar13 ^ 0x1f)) & 0x3f) & 1) != 0)
                 + (uVar13 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar11 = (malloc_tree_chunk *)(_gm_.treebins + uVar13);
    *(uint *)&m->release_checks = uVar13;
    m->dv = (mchunkptr)0x0;
    m->top = (mchunkptr)0x0;
    if ((_gm_.treemap >> (uVar13 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar13 & 0x1f);
      pmVar11->prev_foot = (size_t)m;
    }
    else {
      bVar12 = 0x39 - (char)(uVar13 >> 1);
      if (uVar13 == 0x1f) {
        bVar12 = 0;
      }
      lVar15 = (long)p << (bVar12 & 0x3f);
      pmVar3 = (malloc_tree_chunk *)pmVar11->prev_foot;
      do {
        pmVar11 = pmVar3;
        if ((mchunkptr)(pmVar11->head & 0xfffffffffffffff8) == p) {
          if ((_gm_.least_addr <= pmVar11) && (pmVar3 = pmVar11->fd, _gm_.least_addr <= pmVar3)) {
            pmVar3->bk = (malloc_tree_chunk *)m;
            pmVar11->fd = (malloc_tree_chunk *)m;
            m->topsize = (size_t)pmVar3;
            m->least_addr = (char *)pmVar11;
            m->trim_check = 0;
            return;
          }
          goto LAB_00106ca4;
        }
        lVar5 = lVar15 >> 0x3f;
        lVar15 = lVar15 * 2;
        pmVar3 = *(malloc_tree_chunk **)((long)pmVar11 + lVar5 * -8 + 0x20);
      } while (pmVar3 != (malloc_tree_chunk *)0x0);
      pcVar2 = (char *)((long)pmVar11 + lVar5 * -8 + 0x20);
      if (pcVar2 < _gm_.least_addr) goto LAB_00106ca4;
      *(mstate *)pcVar2 = m;
    }
    m->trim_check = (size_t)pmVar11;
    m->least_addr = (char *)m;
    m->topsize = (size_t)m;
  }
  return;
}

Assistant:

static void dispose_chunk(mstate m, mchunkptr p, size_t psize) {
  mchunkptr next = chunk_plus_offset(p, psize);
  if (!pinuse(p)) {
    mchunkptr prev;
    size_t prevsize = p->prev_foot;
    if (is_mmapped(p)) {
      psize += prevsize + MMAP_FOOT_PAD;
      if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
        m->footprint -= psize;
      return;
    }
    prev = chunk_minus_offset(p, prevsize);
    psize += prevsize;
    p = prev;
    if (RTCHECK(ok_address(m, prev))) { /* consolidate backward */
      if (p != m->dv) {
        unlink_chunk(m, p, prevsize);
      }
      else if ((next->head & INUSE_BITS) == INUSE_BITS) {
        m->dvsize = psize;
        set_free_with_pinuse(p, psize, next);
        return;
      }
    }
    else {
      CORRUPTION_ERROR_ACTION(m);
      return;
    }
  }
  if (RTCHECK(ok_address(m, next))) {
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == m->top) {
        size_t tsize = m->topsize += psize;
        m->top = p;
        p->head = tsize | PINUSE_BIT;
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        return;
      }
      else if (next == m->dv) {
        size_t dsize = m->dvsize += psize;
        m->dv = p;
        set_size_and_pinuse_of_free_chunk(p, dsize);
        return;
      }
      else {
        size_t nsize = chunksize(next);
        psize += nsize;
        unlink_chunk(m, next, nsize);
        set_size_and_pinuse_of_free_chunk(p, psize);
        if (p == m->dv) {
          m->dvsize = psize;
          return;
        }
      }
    }
    else {
      set_free_with_pinuse(p, psize, next);
    }
    insert_chunk(m, p, psize);
  }
  else {
    CORRUPTION_ERROR_ACTION(m);
  }
}